

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O2

vector<Quaternion,_std::allocator<Quaternion>_> *
load_quaternion_cloud
          (vector<Quaternion,_std::allocator<Quaternion>_> *__return_storage_ptr__,string *filename)

{
  pointer *ppQVar1;
  ostream *poVar2;
  long lVar3;
  Quaternion q;
  ifstream stream;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&stream,(string *)filename,_S_in);
  (__return_storage_ptr__->super__Vector_base<Quaternion,_std::allocator<Quaternion>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Quaternion,_std::allocator<Quaternion>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Quaternion,_std::allocator<Quaternion>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while ((abStack_208[*(long *)(_stream + -0x18)] & 2) == 0) {
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 8) {
      std::istream::_M_extract<double>((double *)&stream);
    }
    std::vector<Quaternion,_std::allocator<Quaternion>_>::push_back(__return_storage_ptr__,&q);
  }
  ppQVar1 = &(__return_storage_ptr__->super__Vector_base<Quaternion,_std::allocator<Quaternion>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  *ppQVar1 = *ppQVar1 + -1;
  poVar2 = std::operator<<((ostream *)&std::cout,"Loaded ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," points!");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ifstream::~ifstream(&stream);
  return __return_storage_ptr__;
}

Assistant:

vector<Quaternion> load_quaternion_cloud(const string filename)
{
    ifstream stream(filename); 
    vector<Quaternion> cloud;
    Quaternion q;
    int lines_loaded = 0;
    while (!stream.eof()) {
        for (int i = 0; i < 4; i++) stream >> q.p[i];
        cloud.push_back(q);
        lines_loaded += 1;
    }
    cloud.pop_back();
    cout << "Loaded " << cloud.size() << " points!" << endl;
    return cloud;
}